

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

bool __thiscall
MeCab::DecoderFeatureIndex::buildFeature(DecoderFeatureIndex *this,LearnerPath *path)

{
  DictionaryRewriter *this_00;
  bool bVar1;
  ostream *poVar2;
  string lfeature2;
  string ufeature2;
  string rfeature1;
  string rfeature2;
  string lfeature1;
  string ufeature1;
  die local_fa;
  allocator local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  path->cost = 0.0;
  path->rnode->wcost = 0.0;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_58.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_b8.field_2._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_78.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_f8,path->lnode->feature,&local_f9);
  this_00 = &(this->super_FeatureIndex).rewrite_;
  bVar1 = DictionaryRewriter::rewrite2(this_00,&local_f8,&local_38,&local_58,&local_98);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xef);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,
                             "rewrite_.rewrite2(path->lnode->feature, &ufeature1, &lfeature1, &rfeature1)"
                            );
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2," cannot rewrite pattern: ");
    std::operator<<(poVar2,path->lnode->feature);
    die::~die(&local_fa);
  }
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string((string *)&local_f8,path->rnode->feature,&local_f9);
  bVar1 = DictionaryRewriter::rewrite2(this_00,&local_f8,&local_b8,&local_d8,&local_78);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf6);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,
                             "rewrite_.rewrite2(path->rnode->feature, &ufeature2, &lfeature2, &rfeature2)"
                            );
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2," cannot rewrite pattern: ");
    std::operator<<(poVar2,path->rnode->feature);
    die::~die(&local_fa);
  }
  std::__cxx11::string::~string((string *)&local_f8);
  FeatureIndex::buildUnigramFeature(&this->super_FeatureIndex,path,local_b8._M_dataplus._M_p);
  FeatureIndex::buildBigramFeature
            (&this->super_FeatureIndex,path,local_98._M_dataplus._M_p,local_d8._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return true;
}

Assistant:

bool DecoderFeatureIndex::buildFeature(LearnerPath *path) {
  path->rnode->wcost = path->cost = 0.0;

  std::string ufeature1;
  std::string lfeature1;
  std::string rfeature1;
  std::string ufeature2;
  std::string lfeature2;
  std::string rfeature2;

  CHECK_DIE(rewrite_.rewrite2(path->lnode->feature,
                              &ufeature1,
                              &lfeature1,
                              &rfeature1))
      << " cannot rewrite pattern: "
      << path->lnode->feature;

  CHECK_DIE(rewrite_.rewrite2(path->rnode->feature,
                              &ufeature2,
                              &lfeature2,
                              &rfeature2))
      << " cannot rewrite pattern: "
      << path->rnode->feature;

  if (!buildUnigramFeature(path, ufeature2.c_str())) {
    return false;
  }

  if (!buildBigramFeature(path, rfeature1.c_str(), lfeature2.c_str())) {
    return false;
  }

  return true;
}